

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

UpsampleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_upsample(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xd2) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xd2;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    UpsampleLayerParams::UpsampleLayerParams(this_00.upsample_);
    (this->layer_).upsample_ = (UpsampleLayerParams *)this_00;
  }
  return (UpsampleLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::UpsampleLayerParams* NeuralNetworkLayer::mutable_upsample() {
  if (!has_upsample()) {
    clear_layer();
    set_has_upsample();
    layer_.upsample_ = new ::CoreML::Specification::UpsampleLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.upsample)
  return layer_.upsample_;
}